

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SS.h
# Opt level: O3

void __thiscall SS<4U>::SS(SS<4U> *this,uint32_t _SIZE)

{
  StreamSummary<4U> *this_00;
  
  (this->super_Abstract<4U>).name._M_dataplus._M_p =
       (pointer)&(this->super_Abstract<4U>).name.field_2;
  (this->super_Abstract<4U>).name._M_string_length = 0;
  (this->super_Abstract<4U>).name.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>).sep._M_dataplus._M_p = (pointer)&(this->super_Abstract<4U>).sep.field_2
  ;
  (this->super_Abstract<4U>).sep._M_string_length = 0;
  (this->super_Abstract<4U>).sep.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>).pr = 0.0;
  (this->super_Abstract<4U>).cr = 0.0;
  (this->super_Abstract<4U>).aae = 0.0;
  (this->super_Abstract<4U>).are = 0.0;
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00113bc8;
  std::__cxx11::string::_M_replace((ulong)&(this->super_Abstract<4U>).name,0,(char *)0x0,0x10d955);
  this_00 = (StreamSummary<4U> *)operator_new(0x48);
  StreamSummary<4U>::StreamSummary(this_00,_SIZE);
  this->summary = this_00;
  return;
}

Assistant:

SS(uint32_t _SIZE) {
		this->name = "SS";
		summary = new StreamSummary<DATA_LEN>(_SIZE);
	}